

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3w.c
# Opt level: O0

int parse_version(void)

{
  int local_4;
  
  if (gl3wGetIntegerv == (PFNGLGETINTEGERVPROC)0x0) {
    local_4 = -1;
  }
  else {
    (*gl3wGetIntegerv)(0x821b,&version.major);
    (*gl3wGetIntegerv)(0x821c,(GLint *)0x229fb4);
    if (version.major < 3) {
      local_4 = -1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int parse_version(void)
{
	if (!glGetIntegerv)
		return -1;

	glGetIntegerv(GL_MAJOR_VERSION, &version.major);
	glGetIntegerv(GL_MINOR_VERSION, &version.minor);

	if (version.major < 3)
		return -1;
	return 0;
}